

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtilAsmJs.cpp
# Opt level: O1

char16 * Js::OpCodeUtilAsmJs::GetOpCodeName(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_0000003a;
  uint uVar4;
  undefined8 *puVar5;
  
  if ((uint)CONCAT62(in_register_0000003a,op) < 0x100) {
    puVar5 = (undefined8 *)(OpCodeAsmJsNames + (ulong)op * 8);
  }
  else {
    if (0x271 < op) {
      return L"<NotAvail>";
    }
    uVar4 = op - 0x100;
    if (0x171 < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x24,
                                  "(opIndex < (sizeof(*__countof_helper(ExtendedOpCodeAsmJsNames)) + 0))"
                                  ,"opIndex < _countof(ExtendedOpCodeAsmJsNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    puVar5 = (undefined8 *)(ExtendedOpCodeAsmJsNames + (ulong)uVar4 * 8);
  }
  return (char16 *)*puVar5;
}

Assistant:

char16 const * OpCodeUtilAsmJs::GetOpCodeName(OpCodeAsmJs op)
    {
        if (op <= Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            Assert(op < _countof(OpCodeAsmJsNames));
            __analysis_assume(op < _countof(OpCodeAsmJsNames));
            return OpCodeAsmJsNames[(int)op];
        }
        else if (op < Js::OpCodeAsmJs::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1);
            Assert(opIndex < _countof(ExtendedOpCodeAsmJsNames));
            __analysis_assume(opIndex < _countof(ExtendedOpCodeAsmJsNames));
            return ExtendedOpCodeAsmJsNames[opIndex];
        }
        return _u("<NotAvail>");
    }